

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSM_tree.cpp
# Opt level: O1

void __thiscall LSM_tree::reset(LSM_tree *this)

{
  char cVar1;
  pointer ppLVar2;
  long lVar3;
  ulong uVar4;
  path pStack_38;
  
  std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
            (&pStack_38,(char (*) [5])0x10b262,auto_format);
  cVar1 = std::filesystem::status(&pStack_38);
  std::filesystem::__cxx11::path::~path(&pStack_38);
  if ((cVar1 == '\0') || (cVar1 == -1)) {
    ppLVar2 = (this->disk).super__Vector_base<Level_*,_std::allocator<Level_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->disk).super__Vector_base<Level_*,_std::allocator<Level_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppLVar2) {
      (this->disk).super__Vector_base<Level_*,_std::allocator<Level_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppLVar2;
    }
  }
  else {
    ppLVar2 = (this->disk).super__Vector_base<Level_*,_std::allocator<Level_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->disk).super__Vector_base<Level_*,_std::allocator<Level_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppLVar2) {
      uVar4 = 0;
      do {
        Level::clear(ppLVar2[uVar4]);
        uVar4 = uVar4 + 1;
        ppLVar2 = (this->disk).super__Vector_base<Level_*,_std::allocator<Level_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar4 < (ulong)((long)(this->disk).
                                     super__Vector_base<Level_*,_std::allocator<Level_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)ppLVar2 >> 3));
    }
    std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
              (&pStack_38,(char (*) [5])0x10b262,auto_format);
    lVar3 = std::filesystem::remove_all(&pStack_38);
    std::filesystem::__cxx11::path::~path(&pStack_38);
    if (lVar3 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"fail to remove DATA",0x13);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

void LSM_tree::reset() {


    if(!fs::exists("DATA"))
    {
        disk.clear();
        return;
    }

    for (int i = 0; i < disk.size(); i++) {

        //int size=disk[i]->size();
        Level* level=disk[i];
        level->clear();


    }
    if(!std::filesystem::remove_all("DATA"))
    {
        cout<<"fail to remove DATA"<<endl;
    }

}